

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::findOrEmitObject(SemanticParser *this,SP *pbrtObject)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  ostream *poVar5;
  size_type sVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  SemanticParser *in_RDI;
  SP SVar8;
  shared_ptr<pbrt::syntactic::Object::Instance> instance;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::shared_ptr<pbrt::syntactic::Object::Instance>,_std::allocator<std::shared_ptr<pbrt::syntactic::Object::Instance>_>_>
  *__range1_2;
  SP ourShape;
  shared_ptr<pbrt::syntactic::Shape> shape;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::shared_ptr<pbrt::syntactic::Shape>,_std::allocator<std::shared_ptr<pbrt::syntactic::Shape>_>_>
  *__range1_1;
  SP ourLightSource;
  shared_ptr<pbrt::syntactic::LightSource> lightSource;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<pbrt::syntactic::LightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::LightSource>_>_>
  *__range1;
  SP *ourObject;
  map<std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
  *in_stack_fffffffffffffe08;
  vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
  *in_stack_fffffffffffffe10;
  value_type *in_stack_fffffffffffffe18;
  vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
  *in_stack_fffffffffffffe20;
  key_type *in_stack_fffffffffffffe48;
  map<std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
  *in_stack_fffffffffffffe50;
  SP *in_stack_fffffffffffffe60;
  SemanticParser *in_stack_fffffffffffffe68;
  ostream *in_stack_fffffffffffffe70;
  SemanticParser *in_stack_fffffffffffffe78;
  SemanticParser *this_00;
  __normal_iterator<std::shared_ptr<pbrt::syntactic::Object::Instance>_*,_std::vector<std::shared_ptr<pbrt::syntactic::Object::Instance>,_std::allocator<std::shared_ptr<pbrt::syntactic::Object::Instance>_>_>_>
  local_100;
  vector<std::shared_ptr<pbrt::syntactic::Object::Instance>,_std::allocator<std::shared_ptr<pbrt::syntactic::Object::Instance>_>_>
  *local_f8;
  __shared_ptr local_e0 [32];
  shared_ptr<pbrt::syntactic::Shape> *local_c0;
  __normal_iterator<std::shared_ptr<pbrt::syntactic::Shape>_*,_std::vector<std::shared_ptr<pbrt::syntactic::Shape>,_std::allocator<std::shared_ptr<pbrt::syntactic::Shape>_>_>_>
  local_b8;
  vector<std::shared_ptr<pbrt::syntactic::Shape>,_std::allocator<std::shared_ptr<pbrt::syntactic::Shape>_>_>
  *local_b0;
  string local_a8 [48];
  __shared_ptr local_78 [32];
  shared_ptr<pbrt::syntactic::LightSource> *local_58;
  __normal_iterator<std::shared_ptr<pbrt::syntactic::LightSource>_*,_std::vector<std::shared_ptr<pbrt::syntactic::LightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::LightSource>_>_>_>
  local_50;
  vector<std::shared_ptr<pbrt::syntactic::LightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::LightSource>_>_>
  *local_48;
  undefined1 local_29;
  _Self local_28;
  _Self local_20 [4];
  
  this_00 = in_RDI;
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
       ::find(in_stack_fffffffffffffe08,(key_type *)0x19f101);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
       ::end(in_stack_fffffffffffffe08);
  bVar1 = std::operator!=(local_20,&local_28);
  if (bVar1) {
    std::
    map<std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
    ::operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    std::shared_ptr<pbrt::Object>::shared_ptr
              ((shared_ptr<pbrt::Object> *)in_stack_fffffffffffffe10,
               (shared_ptr<pbrt::Object> *)in_stack_fffffffffffffe08);
    _Var7._M_pi = extraout_RDX;
  }
  else {
    local_29 = 0;
    std::make_shared<pbrt::Object>();
    std::
    map<std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
    ::operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    std::shared_ptr<pbrt::Object>::operator=
              ((shared_ptr<pbrt::Object> *)in_stack_fffffffffffffe10,
               (shared_ptr<pbrt::Object> *)in_stack_fffffffffffffe08);
    peVar2 = std::
             __shared_ptr_access<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x19f1ce);
    peVar3 = std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x19f1e7);
    std::__cxx11::string::operator=((string *)&peVar3->name,(string *)&peVar2->name);
    peVar2 = std::
             __shared_ptr_access<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x19f20a);
    local_48 = &peVar2->lightSources;
    local_50._M_current =
         (shared_ptr<pbrt::syntactic::LightSource> *)
         std::
         vector<std::shared_ptr<pbrt::syntactic::LightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::LightSource>_>_>
         ::begin((vector<std::shared_ptr<pbrt::syntactic::LightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::LightSource>_>_>
                  *)in_stack_fffffffffffffe08);
    local_58 = (shared_ptr<pbrt::syntactic::LightSource> *)
               std::
               vector<std::shared_ptr<pbrt::syntactic::LightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::LightSource>_>_>
               ::end((vector<std::shared_ptr<pbrt::syntactic::LightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::LightSource>_>_>
                      *)in_stack_fffffffffffffe08);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<pbrt::syntactic::LightSource>_*,_std::vector<std::shared_ptr<pbrt::syntactic::LightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::LightSource>_>_>_>
                               *)in_stack_fffffffffffffe10,
                              (__normal_iterator<std::shared_ptr<pbrt::syntactic::LightSource>_*,_std::vector<std::shared_ptr<pbrt::syntactic::LightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::LightSource>_>_>_>
                               *)in_stack_fffffffffffffe08), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<pbrt::syntactic::LightSource>_*,_std::vector<std::shared_ptr<pbrt::syntactic::LightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::LightSource>_>_>_>
      ::operator*(&local_50);
      std::shared_ptr<pbrt::syntactic::LightSource>::shared_ptr
                ((shared_ptr<pbrt::syntactic::LightSource> *)in_stack_fffffffffffffe10,
                 (shared_ptr<pbrt::syntactic::LightSource> *)in_stack_fffffffffffffe08);
      std::shared_ptr<pbrt::syntactic::LightSource>::shared_ptr
                ((shared_ptr<pbrt::syntactic::LightSource> *)in_stack_fffffffffffffe10,
                 (shared_ptr<pbrt::syntactic::LightSource> *)in_stack_fffffffffffffe08);
      findOrCreateLightSource(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      std::shared_ptr<pbrt::syntactic::LightSource>::~shared_ptr
                ((shared_ptr<pbrt::syntactic::LightSource> *)0x19f2cc);
      bVar1 = std::__shared_ptr::operator_cast_to_bool(local_78);
      if (bVar1) {
        std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x19f2ef);
        std::
        vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
        ::push_back(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "***warning***: could ont parse light source \'");
        peVar4 = std::
                 __shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x19f389);
        (**(peVar4->super_Node)._vptr_Node)(local_a8);
        in_stack_fffffffffffffe78 = (SemanticParser *)std::operator<<(poVar5,local_a8);
        in_stack_fffffffffffffe70 = std::operator<<((ostream *)in_stack_fffffffffffffe78,"\'");
        std::ostream::operator<<(in_stack_fffffffffffffe70,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_a8);
      }
      std::shared_ptr<pbrt::LightSource>::~shared_ptr((shared_ptr<pbrt::LightSource> *)0x19f421);
      std::shared_ptr<pbrt::syntactic::LightSource>::~shared_ptr
                ((shared_ptr<pbrt::syntactic::LightSource> *)0x19f42e);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<pbrt::syntactic::LightSource>_*,_std::vector<std::shared_ptr<pbrt::syntactic::LightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::LightSource>_>_>_>
      ::operator++(&local_50);
    }
    peVar2 = std::
             __shared_ptr_access<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x19f46c);
    local_b0 = &peVar2->shapes;
    local_b8._M_current =
         (shared_ptr<pbrt::syntactic::Shape> *)
         std::
         vector<std::shared_ptr<pbrt::syntactic::Shape>,_std::allocator<std::shared_ptr<pbrt::syntactic::Shape>_>_>
         ::begin((vector<std::shared_ptr<pbrt::syntactic::Shape>,_std::allocator<std::shared_ptr<pbrt::syntactic::Shape>_>_>
                  *)in_stack_fffffffffffffe08);
    local_c0 = (shared_ptr<pbrt::syntactic::Shape> *)
               std::
               vector<std::shared_ptr<pbrt::syntactic::Shape>,_std::allocator<std::shared_ptr<pbrt::syntactic::Shape>_>_>
               ::end((vector<std::shared_ptr<pbrt::syntactic::Shape>,_std::allocator<std::shared_ptr<pbrt::syntactic::Shape>_>_>
                      *)in_stack_fffffffffffffe08);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<pbrt::syntactic::Shape>_*,_std::vector<std::shared_ptr<pbrt::syntactic::Shape>,_std::allocator<std::shared_ptr<pbrt::syntactic::Shape>_>_>_>
                               *)in_stack_fffffffffffffe10,
                              (__normal_iterator<std::shared_ptr<pbrt::syntactic::Shape>_*,_std::vector<std::shared_ptr<pbrt::syntactic::Shape>,_std::allocator<std::shared_ptr<pbrt::syntactic::Shape>_>_>_>
                               *)in_stack_fffffffffffffe08), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<pbrt::syntactic::Shape>_*,_std::vector<std::shared_ptr<pbrt::syntactic::Shape>,_std::allocator<std::shared_ptr<pbrt::syntactic::Shape>_>_>_>
      ::operator*(&local_b8);
      std::shared_ptr<pbrt::syntactic::Shape>::shared_ptr
                ((shared_ptr<pbrt::syntactic::Shape> *)in_stack_fffffffffffffe10,
                 (shared_ptr<pbrt::syntactic::Shape> *)in_stack_fffffffffffffe08);
      std::shared_ptr<pbrt::syntactic::Shape>::shared_ptr
                ((shared_ptr<pbrt::syntactic::Shape> *)in_stack_fffffffffffffe10,
                 (shared_ptr<pbrt::syntactic::Shape> *)in_stack_fffffffffffffe08);
      findOrCreateShape(this_00,(SP *)in_RDI);
      std::shared_ptr<pbrt::syntactic::Shape>::~shared_ptr
                ((shared_ptr<pbrt::syntactic::Shape> *)0x19f522);
      bVar1 = std::__shared_ptr::operator_cast_to_bool(local_e0);
      if (bVar1) {
        std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x19f542);
        std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>::
        push_back((vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                   *)in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
      }
      std::shared_ptr<pbrt::Shape>::~shared_ptr((shared_ptr<pbrt::Shape> *)0x19f5ad);
      std::shared_ptr<pbrt::syntactic::Shape>::~shared_ptr
                ((shared_ptr<pbrt::syntactic::Shape> *)0x19f5ba);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<pbrt::syntactic::Shape>_*,_std::vector<std::shared_ptr<pbrt::syntactic::Shape>,_std::allocator<std::shared_ptr<pbrt::syntactic::Shape>_>_>_>
      ::operator++(&local_b8);
    }
    peVar2 = std::
             __shared_ptr_access<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x19f5eb);
    local_f8 = &peVar2->objectInstances;
    local_100._M_current =
         (shared_ptr<pbrt::syntactic::Object::Instance> *)
         std::
         vector<std::shared_ptr<pbrt::syntactic::Object::Instance>,_std::allocator<std::shared_ptr<pbrt::syntactic::Object::Instance>_>_>
         ::begin((vector<std::shared_ptr<pbrt::syntactic::Object::Instance>,_std::allocator<std::shared_ptr<pbrt::syntactic::Object::Instance>_>_>
                  *)in_stack_fffffffffffffe08);
    std::
    vector<std::shared_ptr<pbrt::syntactic::Object::Instance>,_std::allocator<std::shared_ptr<pbrt::syntactic::Object::Instance>_>_>
    ::end((vector<std::shared_ptr<pbrt::syntactic::Object::Instance>,_std::allocator<std::shared_ptr<pbrt::syntactic::Object::Instance>_>_>
           *)in_stack_fffffffffffffe08);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<pbrt::syntactic::Object::Instance>_*,_std::vector<std::shared_ptr<pbrt::syntactic::Object::Instance>,_std::allocator<std::shared_ptr<pbrt::syntactic::Object::Instance>_>_>_>
                               *)in_stack_fffffffffffffe10,
                              (__normal_iterator<std::shared_ptr<pbrt::syntactic::Object::Instance>_*,_std::vector<std::shared_ptr<pbrt::syntactic::Object::Instance>,_std::allocator<std::shared_ptr<pbrt::syntactic::Object::Instance>_>_>_>
                               *)in_stack_fffffffffffffe08), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<pbrt::syntactic::Object::Instance>_*,_std::vector<std::shared_ptr<pbrt::syntactic::Object::Instance>,_std::allocator<std::shared_ptr<pbrt::syntactic::Object::Instance>_>_>_>
      ::operator*(&local_100);
      std::shared_ptr<pbrt::syntactic::Object::Instance>::shared_ptr
                ((shared_ptr<pbrt::syntactic::Object::Instance> *)in_stack_fffffffffffffe10,
                 (shared_ptr<pbrt::syntactic::Object::Instance> *)in_stack_fffffffffffffe08);
      std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x19f66e);
      std::shared_ptr<pbrt::syntactic::Object::Instance>::shared_ptr
                ((shared_ptr<pbrt::syntactic::Object::Instance> *)in_stack_fffffffffffffe10,
                 (shared_ptr<pbrt::syntactic::Object::Instance> *)in_stack_fffffffffffffe08);
      emitInstance(in_stack_fffffffffffffe78,(SP *)in_stack_fffffffffffffe70);
      std::
      vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>::
      push_back(in_stack_fffffffffffffe10,(value_type *)in_stack_fffffffffffffe08);
      std::shared_ptr<pbrt::Instance>::~shared_ptr((shared_ptr<pbrt::Instance> *)0x19f6cb);
      std::shared_ptr<pbrt::syntactic::Object::Instance>::~shared_ptr
                ((shared_ptr<pbrt::syntactic::Object::Instance> *)0x19f6d8);
      std::shared_ptr<pbrt::syntactic::Object::Instance>::~shared_ptr
                ((shared_ptr<pbrt::syntactic::Object::Instance> *)0x19f6e5);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<pbrt::syntactic::Object::Instance>_*,_std::vector<std::shared_ptr<pbrt::syntactic::Object::Instance>,_std::allocator<std::shared_ptr<pbrt::syntactic::Object::Instance>_>_>_>
      ::operator++(&local_100);
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"created object w/ ");
    peVar3 = std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x19f774);
    sVar6 = std::
            vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>::
            size(&peVar3->shapes);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar6);
    poVar5 = std::operator<<(poVar5," shapes, ");
    peVar3 = std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x19f7b9);
    sVar6 = std::
            vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
            ::size(&peVar3->instances);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar6);
    poVar5 = std::operator<<(poVar5," instances, and ");
    peVar3 = std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x19f7fe);
    sVar6 = std::
            vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
            ::size(&peVar3->lightSources);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar6);
    poVar5 = std::operator<<(poVar5," light sources");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    _Var7._M_pi = extraout_RDX_00;
  }
  SVar8.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var7._M_pi
  ;
  SVar8.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00;
  return (SP)SVar8.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Object::SP SemanticParser::findOrEmitObject(pbrt::syntactic::Object::SP pbrtObject)
  {
    if (emittedObjects.find(pbrtObject) != emittedObjects.end()) {
      return emittedObjects[pbrtObject];
    }
      
    Object::SP ourObject = std::make_shared<Object>();
    emittedObjects[pbrtObject] = ourObject;
    ourObject->name = pbrtObject->name;
    
    for (auto lightSource : pbrtObject->lightSources) {
      LightSource::SP ourLightSource = findOrCreateLightSource(lightSource);
      if (ourLightSource)
        ourObject->lightSources.push_back(ourLightSource);
      else
        std::cout << "***warning***: could ont parse light source '" << lightSource->toString() << "'"
                  << std::endl;
    }

    for (auto shape : pbrtObject->shapes) {
      Shape::SP ourShape = findOrCreateShape(shape);
      if (ourShape)
        ourObject->shapes.push_back(ourShape);
    }
    
    for (auto instance : pbrtObject->objectInstances)
      ourObject->instances.push_back(emitInstance(instance));

    std::cout << "created object w/ " << ourObject->shapes.size() << " shapes, "
              << ourObject->instances.size() << " instances, and "
              << ourObject->lightSources.size() << " light sources" << std::endl;
    return ourObject;
  }